

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Create_ghosts_irreg(int type,int ndim,int *dims,int *width,char *name,int *block,int *map)

{
  Integer *map_00;
  logical lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  Integer g_a;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  
  if (ndim < 8) {
    uVar3 = 0;
    uVar2 = 0;
    if (0 < ndim) {
      uVar2 = (ulong)(uint)ndim;
    }
    iVar4 = ndim + -1;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      _ga_dims[iVar4] = (long)dims[uVar3];
      iVar4 = iVar4 + -1;
    }
    iVar4 = ndim + -1;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      _ga_work[iVar4] = (long)block[uVar3];
      iVar4 = iVar4 + -1;
    }
    iVar4 = ndim + -1;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      _ga_width[iVar4] = (long)width[uVar3];
      iVar4 = iVar4 + -1;
    }
    map_00 = copy_map(block,ndim,map);
    _ga_irreg_flag = 1;
    lVar1 = pnga_create_ghosts_irreg
                      ((long)type,(long)ndim,_ga_dims,_ga_width,name,map_00,_ga_work,&g_a);
    _ga_irreg_flag = 0;
    free(map_00);
    if (lVar1 != 1) {
      g_a._0_4_ = 0;
    }
    return (int)g_a;
  }
  return 0;
}

Assistant:

int NGA_Create_ghosts_irreg(int type,int ndim,int dims[],int width[],char *name, int block[],int map[])
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    COPYC2F(width,_ga_width, ndim);
    _ga_map_capi = copy_map(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_ghosts_irreg(type, (Integer)ndim, _ga_dims, _ga_width,
            name, _ga_map_capi, _ga_work, &g_a);
    _ga_irreg_flag = 0; /* unset it, after creating array */ 

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}